

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::readyReadSlot(QHttpThreadDelegate *this)

{
  bool bVar1;
  qint64 qVar2;
  size_t __nbytes;
  QHttpNetworkReply *in_RDI;
  long in_FS_OFFSET;
  qint64 sizeEmitted;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  void *local_60;
  QHttpNetworkReply *this_00;
  QHttpNetworkReply local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)(in_RDI + 0xe) != 0) &&
     (this_00 = in_RDI, bVar1 = QSharedPointer<char>::isNull((QSharedPointer<char> *)0x30f315),
     bVar1)) {
    if (*(long *)&in_RDI[2].field_0x8 == 0) {
      while (bVar1 = QHttpNetworkReply::readAnyAvailable
                               ((QHttpNetworkReply *)
                                CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)),
            bVar1) {
        std::__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x30f4c0);
        QBasicAtomicInteger<int>::fetchAndAddRelease
                  ((QBasicAtomicInteger<int> *)
                   CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
        QHttpNetworkReply::readAny(this_00);
        downloadData((QHttpThreadDelegate *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     (QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        QByteArray::~QByteArray((QByteArray *)0x30f4fc);
      }
    }
    else if ((long)in_RDI[2].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader <
             *(long *)&in_RDI[2].field_0x8) {
      local_60 = (void *)0x0;
      while( true ) {
        bVar1 = QHttpNetworkReply::readAnyAvailable
                          ((QHttpNetworkReply *)
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        in_stack_ffffffffffffff97 = false;
        if (bVar1) {
          in_stack_ffffffffffffff97 =
               (long)local_60 <
               *(long *)&in_RDI[2].field_0x8 -
               (long)in_RDI[2].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader;
        }
        if ((bool)in_stack_ffffffffffffff97 == false) break;
        qVar2 = QHttpNetworkReply::sizeNextBlock
                          ((QHttpNetworkReply *)
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        __nbytes = *(long *)&in_RDI[2].field_0x8 -
                   (long)in_RDI[2].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader;
        if ((long)__nbytes < qVar2) {
          local_60 = (void *)(*(long *)&in_RDI[2].field_0x8 -
                             (long)in_RDI[2].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader);
          in_RDI[2].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
               (_func_int **)
               ((long)local_60 + (long)in_RDI[2].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader);
          std::__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x30f3de);
          QBasicAtomicInteger<int>::fetchAndAddRelease
                    ((QBasicAtomicInteger<int> *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
          QHttpNetworkReply::read(local_20,(int)*(undefined8 *)(in_RDI + 0xe),local_60,__nbytes);
          downloadData((QHttpThreadDelegate *)
                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       (QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          QByteArray::~QByteArray((QByteArray *)0x30f41f);
        }
        else {
          local_60 = (void *)QHttpNetworkReply::sizeNextBlock
                                       ((QHttpNetworkReply *)
                                        CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90
                                                ));
          in_RDI[2].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
               (_func_int **)
               ((long)local_60 + (long)in_RDI[2].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader);
          std::__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x30f452);
          QBasicAtomicInteger<int>::fetchAndAddRelease
                    ((QBasicAtomicInteger<int> *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
          QHttpNetworkReply::readAny(this_00);
          downloadData((QHttpThreadDelegate *)
                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       (QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          QByteArray::~QByteArray((QByteArray *)0x30f48e);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::readyReadSlot()
{
    if (!httpReply)
        return;

    // Don't do in zerocopy case
    if (!downloadBuffer.isNull())
        return;

    if (readBufferMaxSize) {
        if (bytesEmitted < readBufferMaxSize) {
            qint64 sizeEmitted = 0;
            while (httpReply->readAnyAvailable() && (sizeEmitted < (readBufferMaxSize-bytesEmitted))) {
                if (httpReply->sizeNextBlock() > (readBufferMaxSize-bytesEmitted)) {
                    sizeEmitted = readBufferMaxSize-bytesEmitted;
                    bytesEmitted += sizeEmitted;
                    pendingDownloadData->fetchAndAddRelease(1);
                    emit downloadData(httpReply->read(sizeEmitted));
                } else {
                    sizeEmitted = httpReply->sizeNextBlock();
                    bytesEmitted += sizeEmitted;
                    pendingDownloadData->fetchAndAddRelease(1);
                    emit downloadData(httpReply->readAny());
                }
            }
        } else {
            // We need to wait until we empty data from the read buffer in the reply.
        }

    } else {
        while (httpReply->readAnyAvailable()) {
            pendingDownloadData->fetchAndAddRelease(1);
            emit downloadData(httpReply->readAny());
        }
    }
}